

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O1

void __thiscall
duckdb::TopNHeap::AddSmallHeap(TopNHeap *this,DataChunk *input,Vector *sort_keys_vec)

{
  pointer *ppTVar1;
  pointer pTVar2;
  pointer pTVar3;
  iterator __position;
  anon_union_16_2_67f50693_for_value *paVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  string_t *right;
  TopNEntry *entry_1;
  anon_union_16_2_67f50693_for_value *data;
  long lVar8;
  ulong uVar9;
  long lVar10;
  idx_t sel_count;
  anon_struct_16_3_d7536bce_for_pointer aVar11;
  TopNEntry entry;
  anon_union_16_2_67f50693_for_value local_78;
  idx_t local_68;
  DataChunk *local_60;
  vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *local_58;
  data_ptr_t local_50;
  anon_union_16_2_67f50693_for_value local_48;
  idx_t local_38;
  
  if (input->count != 0) {
    local_50 = sort_keys_vec->data;
    local_58 = (vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>> *)&this->heap;
    bVar7 = false;
    uVar9 = 0;
    local_60 = input;
    do {
      right = (string_t *)(local_50 + uVar9 * 0x10);
      pTVar2 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
               super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((ulong)(((long)(this->heap).
                          super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                          super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) *
                  -0x5555555555555555) < this->heap_size) ||
         (bVar6 = string_t::StringComparisonOperators::GreaterThan(&pTVar2->sort_key,right), bVar6))
      {
        local_48._0_8_ = *(undefined8 *)&right->value;
        local_48.pointer.ptr = (right->value).pointer.ptr;
        local_38 = uVar9 + 0xffffffff;
        pTVar2 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar3 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (this->heap_size <= (ulong)(((long)pTVar3 - (long)pTVar2 >> 3) * -0x5555555555555555)) {
          if (0x18 < (long)pTVar3 - (long)pTVar2) {
            local_68 = pTVar3[-1].index;
            local_78._0_8_ = *(undefined8 *)&pTVar3[-1].sort_key.value;
            local_78.pointer.ptr = pTVar3[-1].sort_key.value.pointer.ptr;
            pcVar5 = *(char **)((long)&(pTVar2->sort_key).value + 8);
            *(undefined8 *)&pTVar3[-1].sort_key.value = *(undefined8 *)&(pTVar2->sort_key).value;
            pTVar3[-1].sort_key.value.pointer.ptr = pcVar5;
            pTVar3[-1].index = pTVar2->index;
            ::std::
            __adjust_heap<__gnu_cxx::__normal_iterator<duckdb::TopNEntry*,std::vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>>>,long,duckdb::TopNEntry,__gnu_cxx::__ops::_Iter_less_iter>
                      (pTVar2,0,((long)pTVar3 + (-0x18 - (long)pTVar2) >> 3) * -0x5555555555555555);
          }
          ppTVar1 = &(this->heap).
                     super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + -1;
        }
        __position._M_current =
             (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
             super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
            super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::TopNEntry,std::allocator<duckdb::TopNEntry>>::
          _M_realloc_insert<duckdb::TopNEntry_const&>
                    (local_58,__position,(TopNEntry *)&local_48.pointer);
        }
        else {
          (__position._M_current)->index = local_38;
          *(undefined8 *)&((__position._M_current)->sort_key).value = local_48._0_8_;
          ((__position._M_current)->sort_key).value.pointer.ptr = local_48.pointer.ptr;
          ppTVar1 = &(this->heap).
                     super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + 1;
        }
        pTVar2 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar3 = (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
                 super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_68 = pTVar3[-1].index;
        local_78._0_8_ = *(undefined8 *)&pTVar3[-1].sort_key.value;
        local_78.pointer.ptr = pTVar3[-1].sort_key.value.pointer.ptr;
        lVar8 = ((long)pTVar3 - (long)pTVar2 >> 3) * -0x5555555555555555 + -1;
        if (0x18 < (long)pTVar3 - (long)pTVar2) {
          do {
            lVar10 = (lVar8 - (lVar8 + -1 >> 0x3f)) + -1 >> 1;
            pTVar3 = pTVar2 + lVar10;
            bVar7 = string_t::StringComparisonOperators::GreaterThan
                              ((string_t *)&local_78.pointer,&pTVar3->sort_key);
            if (!bVar7) break;
            pTVar2[lVar8].index = pTVar3->index;
            pcVar5 = (pTVar3->sort_key).value.pointer.ptr;
            *(undefined8 *)&pTVar2[lVar8].sort_key.value = *(undefined8 *)&(pTVar3->sort_key).value;
            *(char **)((long)&pTVar2[lVar8].sort_key.value + 8) = pcVar5;
            bVar7 = 2 < lVar8;
            lVar8 = lVar10;
          } while (bVar7);
        }
        pTVar2[lVar8].index = local_68;
        *(undefined8 *)&pTVar2[lVar8].sort_key.value = local_78._0_8_;
        *(char **)((long)&pTVar2[lVar8].sort_key.value + 8) = local_78.pointer.ptr;
        bVar7 = true;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < local_60->count);
    if (bVar7) {
      data = (anon_union_16_2_67f50693_for_value *)
             (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
             super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
             super__Vector_impl_data._M_start;
      paVar4 = (anon_union_16_2_67f50693_for_value *)
               (this->heap).super_vector<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>.
               super__Vector_base<duckdb::TopNEntry,_std::allocator<duckdb::TopNEntry>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (data == paVar4) {
        sel_count = 0;
      }
      else {
        sel_count = 0;
        do {
          if (0xfffffffe < *(ulong *)(data + 1)) {
            if (0xc < (((string_t *)&(data->pointer).length)->value).pointer.length) {
              aVar11 = (anon_struct_16_3_d7536bce_for_pointer)
                       StringHeap::AddBlob(&this->sort_key_heap,(string_t *)&data->pointer);
              data->pointer = aVar11;
            }
            (this->matching_sel).sel_vector[sel_count] = (int)*(idx_t *)&data[1].pointer.length + 1;
            *(idx_t *)(data + 1) = (this->heap_data).count + sel_count;
            sel_count = sel_count + 1;
          }
          data = (anon_union_16_2_67f50693_for_value *)((long)data + 0x18);
        } while (data != paVar4);
      }
      DataChunk::Append(&this->heap_data,local_60,true,&this->matching_sel,sel_count);
    }
  }
  return;
}

Assistant:

void TopNHeap::AddSmallHeap(DataChunk &input, Vector &sort_keys_vec) {
	// insert the sort keys into the priority queue
	constexpr idx_t BASE_INDEX = NumericLimits<uint32_t>::Maximum();

	bool any_added = false;
	auto sort_key_values = FlatVector::GetData<string_t>(sort_keys_vec);
	for (idx_t r = 0; r < input.size(); r++) {
		auto &sort_key = sort_key_values[r];
		if (!EntryShouldBeAdded(sort_key)) {
			continue;
		}
		// replace the previous top entry with the new entry
		TopNEntry entry;
		entry.sort_key = sort_key;
		entry.index = BASE_INDEX + r;
		AddEntryToHeap(entry);
		any_added = true;
	}
	if (!any_added) {
		// early-out: no matches
		return;
	}

	// for all matching entries we need to copy over the corresponding payload values
	idx_t match_count = 0;
	for (auto &entry : heap) {
		if (entry.index < BASE_INDEX) {
			continue;
		}
		// this entry was added in this chunk
		// if not inlined - copy over the string to the string heap
		if (!entry.sort_key.IsInlined()) {
			entry.sort_key = sort_key_heap.AddBlob(entry.sort_key);
		}
		// to finalize the addition of this entry we need to move over the payload data
		matching_sel.set_index(match_count, entry.index - BASE_INDEX);
		entry.index = heap_data.size() + match_count;
		match_count++;
	}

	// copy over the input rows to the payload chunk
	heap_data.Append(input, true, &matching_sel, match_count);
}